

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::unregister
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this,
          Configuration **ptr)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  const_iterator __position;
  
  if (*ptr != (Configuration *)0x0) {
    iVar1 = (*(this->
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[5])();
    __position._M_current = (Configuration **)CONCAT44(extraout_var,iVar1);
    while( true ) {
      iVar1 = (*(this->
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                ).super_ThreadSafe._vptr_ThreadSafe[6])(this);
      if ((__position._M_current == (Configuration **)CONCAT44(extraout_var_00,iVar1)) ||
         (*ptr == *__position._M_current)) break;
      __position._M_current = __position._M_current + 1;
    }
    iVar1 = (*(this->
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[6])(this);
    if ((__position._M_current != (Configuration **)CONCAT44(extraout_var_01,iVar1)) &&
       (*__position._M_current != (Configuration *)0x0)) {
      iVar1 = (*(this->
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
      std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::erase
                ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                 CONCAT44(extraout_var_02,iVar1),__position);
      safeDelete<el::Configuration>(__position._M_current);
      return;
    }
  }
  return;
}

Assistant:

virtual void unregister(T_Ptr*& ptr) ELPP_FINAL {
    if (ptr) {
      iterator iter = this->begin();
      for (; iter != this->end(); ++iter) {
        if (ptr == *iter) {
          break;
        }
      }
      if (iter != this->end() && *iter != nullptr) {
        this->list().erase(iter);
        base::utils::safeDelete(*iter);
      }
    }
  }